

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

QString * __thiscall
QJsonValueConstRef::concreteString
          (QString *__return_storage_ptr__,QJsonValueConstRef *this,QJsonValueConstRef self,
          QString *defaultValue)

{
  ulong idx;
  
  idx = (ulong)self.field_0.a >> (~self.field_0._0_1_ & 1);
  if ((((QCborContainerPrivate *)(this->field_0).a)->elements).d.ptr[idx].type == String) {
    QCborContainerPrivate::stringAt
              (__return_storage_ptr__,(QCborContainerPrivate *)(this->field_0).a,idx);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,self._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QJsonValueConstRef::concreteString(QJsonValueConstRef self, const QString &defaultValue)
{
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);
    if (d->elements.at(index).type != QCborValue::String)
        return defaultValue;
    return d->stringAt(index);
}